

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void __thiscall snestistics::LargeBitfield::set_bit(LargeBitfield *this,uint32_t p,bool newStat)

{
  uint uVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  uVar1 = this->_state[p >> 5];
  uVar2 = uVar1 | 1 << (p & 0x1f);
  if ((int)CONCAT71(in_register_00000011,newStat) == 0) {
    uVar2 = uVar1 & ~(1 << (p & 0x1f));
  }
  this->_state[p >> 5] = uVar2;
  if (((uVar2 >> (p & 0x1f) & 1) != 0) == newStat) {
    return;
  }
  __assert_fail("this->operator[](p) == newStat",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                ,0x44,"void snestistics::LargeBitfield::set_bit(const uint32_t, const bool)");
}

Assistant:

void set_bit(const uint32_t p, const bool newStat = true) {
		uint32_t bucket = p / 32;
		uint32_t mask = 1 << (p & 31);
		uint32_t current = _state[bucket] & ~mask;
		if (newStat)
			current |= mask;
		_state[bucket] = current;
		assert(this->operator[](p) == newStat);
	}